

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Sol * exampleA(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs)

{
  pointer *pprVar1;
  vector<ride,std::allocator<ride>> *this;
  ride *__args;
  iterator iVar2;
  pointer pvVar3;
  pointer prVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  allocator_type local_11;
  
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,&local_11);
  this = (vector<ride,std::allocator<ride>> *)
         (__return_storage_ptr__->
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  __args = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2._M_current = *(ride **)(this + 8);
  if (iVar2._M_current == *(ride **)(this + 0x10)) {
    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>(this,iVar2,__args);
  }
  else {
    lVar5 = __args->id;
    lVar6 = __args->s_time;
    lVar7 = __args->e_time;
    lVar8 = __args->len;
    lVar9 = (__args->start).x;
    lVar10 = (__args->start).y;
    lVar11 = (__args->end).y;
    ((iVar2._M_current)->end).x = (__args->end).x;
    ((iVar2._M_current)->end).y = lVar11;
    ((iVar2._M_current)->start).x = lVar9;
    ((iVar2._M_current)->start).y = lVar10;
    (iVar2._M_current)->e_time = lVar7;
    (iVar2._M_current)->len = lVar8;
    (iVar2._M_current)->id = lVar5;
    (iVar2._M_current)->s_time = lVar6;
    *(long *)(this + 8) = *(long *)(this + 8) + 0x40;
  }
  pvVar3 = (__return_storage_ptr__->
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  prVar4 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
              ((vector<ride,std::allocator<ride>> *)(pvVar3 + 1),iVar2,prVar4 + 2);
  }
  else {
    lVar5 = prVar4[2].id;
    lVar6 = prVar4[2].s_time;
    lVar7 = prVar4[2].e_time;
    lVar8 = prVar4[2].len;
    lVar9 = prVar4[2].start.x;
    lVar10 = prVar4[2].start.y;
    lVar11 = prVar4[2].end.y;
    ((iVar2._M_current)->end).x = prVar4[2].end.x;
    ((iVar2._M_current)->end).y = lVar11;
    ((iVar2._M_current)->start).x = lVar9;
    ((iVar2._M_current)->start).y = lVar10;
    (iVar2._M_current)->e_time = lVar7;
    (iVar2._M_current)->len = lVar8;
    (iVar2._M_current)->id = lVar5;
    (iVar2._M_current)->s_time = lVar6;
    pprVar1 = (pointer *)
              ((long)&pvVar3[1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                      super__Vector_impl_data + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  pvVar3 = (__return_storage_ptr__->
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  prVar4 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
              ((vector<ride,std::allocator<ride>> *)(pvVar3 + 1),iVar2,prVar4 + 1);
  }
  else {
    lVar5 = prVar4[1].id;
    lVar6 = prVar4[1].s_time;
    lVar7 = prVar4[1].e_time;
    lVar8 = prVar4[1].len;
    lVar9 = prVar4[1].start.x;
    lVar10 = prVar4[1].start.y;
    lVar11 = prVar4[1].end.y;
    ((iVar2._M_current)->end).x = prVar4[1].end.x;
    ((iVar2._M_current)->end).y = lVar11;
    ((iVar2._M_current)->start).x = lVar9;
    ((iVar2._M_current)->start).y = lVar10;
    (iVar2._M_current)->e_time = lVar7;
    (iVar2._M_current)->len = lVar8;
    (iVar2._M_current)->id = lVar5;
    (iVar2._M_current)->s_time = lVar6;
    pprVar1 = (pointer *)
              ((long)&pvVar3[1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                      super__Vector_impl_data + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Sol exampleA(const vector<ride>& rides, const long vehs) {
    Sol sol(vehs);

    // Example A:
    sol[0].push_back(rides[0]);
    sol[1].push_back(rides[2]);
    sol[1].push_back(rides[1]);

    return sol;
}